

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

ssize_t hpeek(hFILE *fp,void *buffer,size_t nbytes)

{
  ssize_t sVar1;
  ssize_t ret;
  size_t n;
  size_t nbytes_local;
  void *buffer_local;
  hFILE *fp_local;
  
  for (ret = (long)fp->end - (long)fp->begin; (ulong)ret < nbytes; ret = sVar1 + ret) {
    sVar1 = refill_buffer(fp);
    if (sVar1 < 0) {
      return sVar1;
    }
    if (sVar1 == 0) break;
  }
  if (nbytes < (ulong)ret) {
    ret = nbytes;
  }
  memcpy(buffer,fp->begin,ret);
  return ret;
}

Assistant:

ssize_t hpeek(hFILE *fp, void *buffer, size_t nbytes)
{
    size_t n = fp->end - fp->begin;
    while (n < nbytes) {
        ssize_t ret = refill_buffer(fp);
        if (ret < 0) return ret;
        else if (ret == 0) break;
        else n += ret;
    }

    if (n > nbytes) n = nbytes;
    memcpy(buffer, fp->begin, n);
    return n;
}